

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_attr(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  exr_attribute_t *a_00;
  _internal_exr_context *in_RSI;
  _internal_exr_context *in_RDI;
  _internal_exr_context *unaff_retaddr;
  exr_result_t rv;
  _internal_exr_context *in_stack_00000020;
  exr_attribute_t *in_stack_00000028;
  _internal_exr_context *in_stack_00000030;
  exr_attribute_t *in_stack_00000058;
  _internal_exr_context *in_stack_00000060;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar1 = (*in_RDI->do_write)(in_RDI,*(void **)in_RSI,(ulong)*(byte *)&(in_RSI->filename).str + 1,
                              &in_RDI->output_file_offset);
  if ((eVar1 == 0) &&
     (eVar1 = (*in_RDI->do_write)(in_RDI,*(void **)&in_RSI->filename,
                                  (ulong)*(byte *)((long)&(in_RSI->filename).str + 1) + 1,
                                  &in_RDI->output_file_offset), eVar1 == 0)) {
    a_00 = (exr_attribute_t *)(ulong)*(uint *)((long)&(in_RSI->filename).str + 4);
    switch(a_00) {
    case (exr_attribute_t *)0x0:
    case (exr_attribute_t *)0x1e:
    default:
      eVar1 = (*in_RDI->standard_error)(in_RDI,0xe);
      break;
    case (exr_attribute_t *)0x1:
      eVar1 = save_box2i(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x2:
      eVar1 = save_box2f(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x3:
      eVar1 = save_chlist(in_stack_00000020,(exr_attribute_t *)ctxt);
      break;
    case (exr_attribute_t *)0x4:
      eVar1 = save_chromaticities(unaff_retaddr,
                                  (exr_attribute_t *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      break;
    case (exr_attribute_t *)0x5:
      eVar1 = save_attr_uint8((_internal_exr_context *)(ulong)in_stack_ffffffffffffffe0,a_00);
      break;
    case (exr_attribute_t *)0x6:
      eVar1 = save_attr_double(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x7:
      eVar1 = save_attr_uint8((_internal_exr_context *)(ulong)in_stack_ffffffffffffffe0,a_00);
      break;
    case (exr_attribute_t *)0x8:
      eVar1 = save_attr_float((_internal_exr_context *)(ulong)in_stack_ffffffffffffffe0,a_00);
      break;
    case (exr_attribute_t *)0x9:
      eVar1 = save_float_vector(in_RSI,(exr_attribute_t *)(ulong)in_stack_ffffffffffffffe0);
      break;
    case (exr_attribute_t *)0xa:
      eVar1 = save_attr_int((_internal_exr_context *)(ulong)in_stack_ffffffffffffffe0,a_00);
      break;
    case (exr_attribute_t *)0xb:
      eVar1 = save_keycode(unaff_retaddr,
                           (exr_attribute_t *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      break;
    case (exr_attribute_t *)0xc:
      eVar1 = save_attr_uint8((_internal_exr_context *)(ulong)in_stack_ffffffffffffffe0,a_00);
      break;
    case (exr_attribute_t *)0xd:
      eVar1 = save_m33f(unaff_retaddr,
                        (exr_attribute_t *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      break;
    case (exr_attribute_t *)0xe:
      eVar1 = save_m33d(in_stack_00000030,in_stack_00000028);
      break;
    case (exr_attribute_t *)0xf:
      eVar1 = save_m44f(in_stack_00000020,(exr_attribute_t *)ctxt);
      break;
    case (exr_attribute_t *)0x10:
      eVar1 = save_m44d(in_stack_00000060,in_stack_00000058);
      break;
    case (exr_attribute_t *)0x11:
      eVar1 = save_preview(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x12:
      eVar1 = save_rational(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x13:
      eVar1 = save_string(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x14:
      eVar1 = save_string_vector(unaff_retaddr,
                                 (exr_attribute_t *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      break;
    case (exr_attribute_t *)0x15:
      eVar1 = save_tiledesc(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x16:
      eVar1 = save_timecode(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x17:
      eVar1 = save_v2i(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x18:
      eVar1 = save_v2f(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x19:
      eVar1 = save_v2d(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x1a:
      eVar1 = save_v3i(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x1b:
      eVar1 = save_v3f(in_RDI,(exr_attribute_t *)in_RSI);
      break;
    case (exr_attribute_t *)0x1c:
      eVar1 = save_v3d(unaff_retaddr,
                       (exr_attribute_t *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      break;
    case (exr_attribute_t *)0x1d:
      eVar1 = save_opaque(in_RSI,(exr_attribute_t *)(ulong)in_stack_ffffffffffffffe0);
    }
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_attr (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;

    rv = ctxt->do_write (
        ctxt, a->name, a->name_length + 1, &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = ctxt->do_write (
        ctxt,
        a->type_name,
        a->type_name_length + 1,
        &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;

    switch (a->type)
    {
        case EXR_ATTR_BOX2I: rv = save_box2i (ctxt, a); break;
        case EXR_ATTR_BOX2F: rv = save_box2f (ctxt, a); break;
        case EXR_ATTR_CHLIST: rv = save_chlist (ctxt, a); break;
        case EXR_ATTR_CHROMATICITIES: rv = save_chromaticities (ctxt, a); break;
        case EXR_ATTR_COMPRESSION: rv = save_attr_uint8 (ctxt, a); break;
        case EXR_ATTR_DOUBLE: rv = save_attr_double (ctxt, a); break;
        case EXR_ATTR_ENVMAP: rv = save_attr_uint8 (ctxt, a); break;
        case EXR_ATTR_FLOAT: rv = save_attr_float (ctxt, a); break;
        case EXR_ATTR_FLOAT_VECTOR: rv = save_float_vector (ctxt, a); break;
        case EXR_ATTR_INT: rv = save_attr_int (ctxt, a); break;
        case EXR_ATTR_KEYCODE: rv = save_keycode (ctxt, a); break;
        case EXR_ATTR_LINEORDER: rv = save_attr_uint8 (ctxt, a); break;
        case EXR_ATTR_M33F: rv = save_m33f (ctxt, a); break;
        case EXR_ATTR_M33D: rv = save_m33d (ctxt, a); break;
        case EXR_ATTR_M44F: rv = save_m44f (ctxt, a); break;
        case EXR_ATTR_M44D: rv = save_m44d (ctxt, a); break;
        case EXR_ATTR_PREVIEW: rv = save_preview (ctxt, a); break;
        case EXR_ATTR_RATIONAL: rv = save_rational (ctxt, a); break;
        case EXR_ATTR_STRING: rv = save_string (ctxt, a); break;
        case EXR_ATTR_STRING_VECTOR: rv = save_string_vector (ctxt, a); break;
        case EXR_ATTR_TILEDESC: rv = save_tiledesc (ctxt, a); break;
        case EXR_ATTR_TIMECODE: rv = save_timecode (ctxt, a); break;
        case EXR_ATTR_V2I: rv = save_v2i (ctxt, a); break;
        case EXR_ATTR_V2F: rv = save_v2f (ctxt, a); break;
        case EXR_ATTR_V2D: rv = save_v2d (ctxt, a); break;
        case EXR_ATTR_V3I: rv = save_v3i (ctxt, a); break;
        case EXR_ATTR_V3F: rv = save_v3f (ctxt, a); break;
        case EXR_ATTR_V3D: rv = save_v3d (ctxt, a); break;
        case EXR_ATTR_OPAQUE: rv = save_opaque (ctxt, a); break;

        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default: rv = ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR); break;
    }
    return rv;
}